

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::ImGuiIO(ImGuiIO *this)

{
  ImVec2 *local_48;
  int local_3c;
  int local_38;
  int i_2;
  int i_1;
  int i;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiIO *local_10;
  ImGuiIO *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->DisplaySize);
  ImVec2::ImVec2(&this->DisplayFramebufferScale);
  ImVec2::ImVec2(&this->DisplayVisibleMin);
  ImVec2::ImVec2(&this->DisplayVisibleMax);
  ImVec2::ImVec2(&this->MousePos);
  ImVec2::ImVec2(&this->MousePosPrev);
  ImVec2::ImVec2(&this->MouseDelta);
  local_48 = this->MouseClickedPos;
  do {
    ImVec2::ImVec2(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (ImVec2 *)this->MouseClickedTime);
  memset(this,0,0x13e8);
  ImVec2::ImVec2(&local_18,-1.0,-1.0);
  this->DisplaySize = local_18;
  this->DeltaTime = 0.016666668;
  this->IniSavingRate = 5.0;
  this->IniFilename = "imgui.ini";
  this->LogFilename = "imgui_log.txt";
  this->Fonts = &GImDefaultFontAtlas;
  this->FontGlobalScale = 1.0;
  ImVec2::ImVec2(&local_20,1.0,1.0);
  this->DisplayFramebufferScale = local_20;
  ImVec2::ImVec2(&local_28,-1.0,-1.0);
  this->MousePos = local_28;
  ImVec2::ImVec2((ImVec2 *)&i_1,-1.0,-1.0);
  this->MousePosPrev = _i_1;
  this->MouseDoubleClickTime = 0.3;
  this->MouseDoubleClickMaxDist = 6.0;
  this->MouseDragThreshold = 6.0;
  for (i_2 = 0; i_2 < 5; i_2 = i_2 + 1) {
    this->MouseDownDurationPrev[i_2] = -1.0;
    this->MouseDownDuration[i_2] = -1.0;
  }
  for (local_38 = 0; local_38 < 0x200; local_38 = local_38 + 1) {
    this->KeysDownDurationPrev[local_38] = -1.0;
    this->KeysDownDuration[local_38] = -1.0;
  }
  for (local_3c = 0; local_3c < 0x13; local_3c = local_3c + 1) {
    this->KeyMap[local_3c] = -1;
  }
  this->KeyRepeatDelay = 0.25;
  this->KeyRepeatRate = 0.05;
  this->UserData = (void *)0x0;
  this->RenderDrawListsFn = (_func_void_ImDrawData_ptr *)0x0;
  this->MemAllocFn = malloc;
  this->MemFreeFn = free;
  this->GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;
  this->SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
  this->ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
  return;
}

Assistant:

ImGuiIO::ImGuiIO()
{
    // Most fields are initialized with zero
    memset(this, 0, sizeof(*this));

    DisplaySize = ImVec2(-1.0f, -1.0f);
    DeltaTime = 1.0f/60.0f;
    IniSavingRate = 5.0f;
    IniFilename = "imgui.ini";
    LogFilename = "imgui_log.txt";
    Fonts = &GImDefaultFontAtlas;
    FontGlobalScale = 1.0f;
    DisplayFramebufferScale = ImVec2(1.0f, 1.0f);
    MousePos = ImVec2(-1,-1);
    MousePosPrev = ImVec2(-1,-1);
    MouseDoubleClickTime = 0.30f;
    MouseDoubleClickMaxDist = 6.0f;
    MouseDragThreshold = 6.0f;
    for (int i = 0; i < IM_ARRAYSIZE(MouseDownDuration); i++)
        MouseDownDuration[i] = MouseDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(KeysDownDuration); i++)
        KeysDownDuration[i] = KeysDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < ImGuiKey_COUNT; i++)
        KeyMap[i] = -1;
    KeyRepeatDelay = 0.250f;
    KeyRepeatRate = 0.050f;
    UserData = NULL;

    // User functions
    RenderDrawListsFn = NULL;
    MemAllocFn = malloc;
    MemFreeFn = free;
    GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;   // Platform dependent default implementations
    SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
    ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;

    // Set OS X style defaults based on __APPLE__ compile time flag
#ifdef __APPLE__
    OSXBehaviors = true;
#endif
}